

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::TryRemovePrefix_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,string_view prefix,string_view value)

{
  size_t sVar1;
  char cVar2;
  size_type sVar3;
  const_reference pvVar4;
  uchar *puVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  bool bVar9;
  allocator<char> local_a1;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  allocator<char> local_8a;
  allocator<char> local_89;
  undefined4 local_88;
  allocator<char> local_81;
  ulong local_80;
  size_t value_index;
  size_t prefix_index;
  size_t i;
  allocator<char> local_51;
  string local_50 [8];
  string prefix_to_match;
  string_view value_local;
  string_view prefix_local;
  
  value_local._M_len = value._M_len;
  prefix_to_match.field_2._8_8_ = prefix._M_str;
  value_local._M_str = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"",&local_51);
  std::allocator<char>::~allocator(&local_51);
  for (prefix_index = 0; sVar1 = prefix_index,
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&value_local._M_str),
      sVar1 < sVar3; prefix_index = prefix_index + 1) {
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&value_local._M_str,
                        prefix_index);
    if (*pvVar4 != '_') {
      puVar5 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   &value_local._M_str,prefix_index);
      cVar2 = absl::lts_20240722::ascii_tolower(*puVar5);
      std::__cxx11::string::operator+=(local_50,cVar2);
    }
  }
  value_index = 0;
  local_80 = 0;
  while( true ) {
    sVar1 = value_index;
    uVar6 = std::__cxx11::string::size();
    uVar8 = local_80;
    bVar9 = false;
    if (sVar1 < uVar6) {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         ((long)&prefix_to_match.field_2 + 8));
      bVar9 = uVar8 < sVar3;
    }
    sVar1 = value_index;
    if (!bVar9) break;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)
                        ((long)&prefix_to_match.field_2 + 8),local_80);
    if (*pvVar4 != '_') {
      puVar5 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   ((long)&prefix_to_match.field_2 + 8),local_80);
      cVar2 = absl::lts_20240722::ascii_tolower(*puVar5);
      value_index = value_index + 1;
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
      if (cVar2 != *pcVar7) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)__return_storage_ptr__,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   ((long)&prefix_to_match.field_2 + 8),&local_81);
        std::allocator<char>::~allocator(&local_81);
LAB_00362f39:
        local_88 = 1;
        std::__cxx11::string::~string(local_50);
        return __return_storage_ptr__;
      }
    }
    local_80 = local_80 + 1;
  }
  uVar8 = std::__cxx11::string::size();
  if (sVar1 < uVar8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)
               ((long)&prefix_to_match.field_2 + 8),&local_89);
    std::allocator<char>::~allocator(&local_89);
  }
  else {
    while( true ) {
      uVar8 = local_80;
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         ((long)&prefix_to_match.field_2 + 8));
      bVar9 = false;
      if (uVar8 < sVar3) {
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            ((long)&prefix_to_match.field_2 + 8),local_80);
        bVar9 = *pvVar4 == '_';
      }
      uVar8 = local_80;
      if (!bVar9) break;
      local_80 = local_80 + 1;
    }
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       ((long)&prefix_to_match.field_2 + 8));
    if (uVar8 == sVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 ((long)&prefix_to_match.field_2 + 8),&local_8a);
      std::allocator<char>::~allocator(&local_8a);
    }
    else {
      local_a0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            ((long)&prefix_to_match.field_2 + 8),local_80,0xffffffffffffffff);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,&local_a0,&local_a1);
      std::allocator<char>::~allocator(&local_a1);
    }
  }
  goto LAB_00362f39;
}

Assistant:

std::string TryRemovePrefix(absl::string_view prefix, absl::string_view value) {
  // First normalize to a lower-case no-underscores prefix to match against
  std::string prefix_to_match = "";
  for (size_t i = 0; i < prefix.size(); i++) {
    if (prefix[i] != '_') {
      prefix_to_match += absl::ascii_tolower(prefix[i]);
    }
  }

  // This keeps track of how much of value we've consumed
  size_t prefix_index, value_index;
  for (prefix_index = 0, value_index = 0;
       prefix_index < prefix_to_match.size() && value_index < value.size();
       value_index++) {
    // Skip over underscores in the value
    if (value[value_index] == '_') {
      continue;
    }
    if (absl::ascii_tolower(value[value_index]) !=
        prefix_to_match[prefix_index++]) {
      // Failed to match the prefix - bail out early.
      return std::string(value);
    }
  }

  // If we didn't finish looking through the prefix, we can't strip it.
  if (prefix_index < prefix_to_match.size()) {
    return std::string(value);
  }

  // Step over any underscores after the prefix
  while (value_index < value.size() && value[value_index] == '_') {
    value_index++;
  }

  // If there's nothing left (e.g. it was a prefix with only underscores
  // afterwards), don't strip.
  if (value_index == value.size()) {
    return std::string(value);
  }

  return std::string(value.substr(value_index));
}